

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

JSON_Status json_serialize_to_buffer_pretty(JSON_Value *value,char *buf,size_t buf_size_in_bytes)

{
  int iVar1;
  size_t sVar2;
  size_t needed_size_in_bytes;
  int written;
  size_t buf_size_in_bytes_local;
  char *buf_local;
  JSON_Value *value_local;
  
  sVar2 = json_serialization_size_pretty(value);
  if ((sVar2 == 0) || (buf_size_in_bytes < sVar2)) {
    value_local._4_4_ = -1;
  }
  else {
    iVar1 = json_serialize_to_buffer_r(value,buf,0,1,(char *)0x0);
    if (iVar1 < 0) {
      value_local._4_4_ = -1;
    }
    else {
      value_local._4_4_ = 0;
    }
  }
  return value_local._4_4_;
}

Assistant:

JSON_Status json_serialize_to_buffer_pretty(const JSON_Value *value, char *buf, size_t buf_size_in_bytes) {
    int written = -1;
    size_t needed_size_in_bytes = json_serialization_size_pretty(value);
    if (needed_size_in_bytes == 0 || buf_size_in_bytes < needed_size_in_bytes) {
        return JSONFailure;
    }
    written = json_serialize_to_buffer_r(value, buf, 0, PARSON_TRUE, NULL);
    if (written < 0) {
        return JSONFailure;
    }
    return JSONSuccess;
}